

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.cpp
# Opt level: O0

void __thiscall
sc_core::sc_signal<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>::update
          (sc_signal<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1> *this)

{
  bool bVar1;
  sc_signal<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1> *in_RDI;
  
  sc_writer_policy_check_delta::update((sc_writer_policy_check_delta *)in_RDI);
  bVar1 = sc_dt::operator==(&(in_RDI->
                             super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).
                             m_new_val,
                            &(in_RDI->
                             super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).
                             m_cur_val);
  if (!bVar1) {
    do_update(in_RDI);
  }
  return;
}

Assistant:

void
sc_signal<sc_logic,POL>::update()
{
    policy_type::update();
    if( !( base_type::m_new_val == base_type::m_cur_val ) ) {
        do_update();
    }
}